

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string * __thiscall Token::get_lexeme_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

string Token::get_lexeme()
{
	return this->lexeme;
}